

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::ShapeFunctions
          (ChElementShellANCF_3423 *this,ShapeVector *N,double x,double y,double z)

{
  double dVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  
  auVar2 = vpermi2pd_avx512f(_DAT_009aaa80,ZEXT864((ulong)(1.0 - y)),
                             ZEXT1664(CONCAT88(y + 1.0,y + 1.0)));
  auVar6._8_8_ = 0x3fd0000000000000;
  auVar6._0_8_ = 0x3fd0000000000000;
  auVar6._16_8_ = 0x3fd0000000000000;
  auVar6._24_8_ = 0x3fd0000000000000;
  dVar1 = x + 1.0;
  auVar3._8_8_ = dVar1;
  auVar3._0_8_ = dVar1;
  auVar3._16_8_ = dVar1;
  auVar3._24_8_ = dVar1;
  auVar5 = ZEXT1632(CONCAT88(z * this->m_thickness * 0.5 * 0.25,1.0 - x));
  auVar3 = vblendpd_avx(auVar5,auVar3,0xc);
  auVar5 = vpermpd_avx2(auVar5,0x60);
  auVar5 = vunpckhpd_avx(auVar6,auVar5);
  auVar4 = ZEXT3264(CONCAT824(auVar3._24_8_ * auVar5._24_8_,
                              CONCAT816(auVar3._16_8_ * auVar5._16_8_,
                                        CONCAT88(auVar3._8_8_ * auVar5._8_8_,
                                                 auVar3._0_8_ * auVar5._0_8_))));
  auVar4 = vshuff64x2_avx512f(auVar4,auVar4,0x14);
  auVar2 = vmulpd_avx512f(auVar4,auVar2);
  *(undefined1 (*) [64])
   (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array = auVar2
  ;
  return;
}

Assistant:

void ChElementShellANCF_3423::ShapeFunctions(ShapeVector& N, double x, double y, double z) {
    double c = m_thickness;
    N(0) = 0.25 * (1.0 - x) * (1.0 - y);
    N(1) = z * c / 2.0 * 0.25 * (1.0 - x) * (1.0 - y);
    N(2) = 0.25 * (1.0 + x) * (1.0 - y);
    N(3) = z * c / 2.0 * 0.25 * (1.0 + x) * (1.0 - y);
    N(4) = 0.25 * (1.0 + x) * (1.0 + y);
    N(5) = z * c / 2.0 * 0.25 * (1.0 + x) * (1.0 + y);
    N(6) = 0.25 * (1.0 - x) * (1.0 + y);
    N(7) = z * c / 2.0 * 0.25 * (1.0 - x) * (1.0 + y);
}